

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetch.c
# Opt level: O3

int main(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar1 = OSSL_LIB_CTX_new();
  if (lVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    uVar4 = 1;
  }
  else {
    lVar2 = OSSL_PROVIDER_load(lVar1,"blake3");
    if (lVar2 == 0) {
      ERR_print_errors_fp(_stderr);
      uVar4 = 1;
    }
    else {
      lVar3 = EVP_MD_fetch(lVar1,"blake3",0);
      if (lVar3 == 0) {
        ERR_print_errors_fp(_stderr);
      }
      else {
        puts("Success!");
        EVP_MD_free(lVar3);
      }
      uVar4 = (uint)(lVar3 == 0);
      OSSL_PROVIDER_unload(lVar2);
    }
    OSSL_LIB_CTX_free(lVar1);
  }
  return uVar4;
}

Assistant:

int main()
{
	OSSL_LIB_CTX *ctx;
	OSSL_PROVIDER *prov = NULL;
	EVP_MD *md = NULL;
	int ret = 0;

	ctx = OSSL_LIB_CTX_new();
	if (!ctx) {
		ERR_print_errors_fp(stderr);
		ret = 1;
		goto exit;
	}

	prov = OSSL_PROVIDER_load(ctx, "blake3");
	if (!prov) {
		ERR_print_errors_fp(stderr);
		ret = 1;
		goto free_ctx;
	}

	md = EVP_MD_fetch(ctx, "blake3", NULL);
	if (!md) {
		ERR_print_errors_fp(stderr);
		ret = 1;
		goto prov_unload;
	}

	printf("Success!\n");

md_free:
	EVP_MD_free(md);
prov_unload:
	OSSL_PROVIDER_unload(prov);
free_ctx:
	OSSL_LIB_CTX_free(ctx);
exit:
	return ret;
}